

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STL_Exercises.cpp
# Opt level: O0

void Question_1(void)

{
  istream *piVar1;
  pointer *ppiStack_3aa70;
  vector<int,_std::allocator<int>_> *pvStack_3aa38;
  int iStack_3aa2c;
  value_type vStack_3aa28;
  int i_1;
  int i;
  int iStack_3aa18;
  int iStack_3aa14;
  int m;
  int n;
  int b;
  int a;
  vector<int,_std::allocator<int>_> v [10005];
  
  pvStack_3aa38 = (vector<int,_std::allocator<int>_> *)&b;
  do {
    std::vector<int,_std::allocator<int>_>::vector(pvStack_3aa38);
    pvStack_3aa38 = pvStack_3aa38 + 1;
  } while (pvStack_3aa38 !=
           (vector<int,_std::allocator<int>_> *)
           &v[0x2714].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage);
  piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,&iStack_3aa14);
  std::istream::operator>>(piVar1,&iStack_3aa18);
  for (vStack_3aa28 = 0; vStack_3aa28 < iStack_3aa14; vStack_3aa28 = vStack_3aa28 + 1) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)(&b + (long)vStack_3aa28 * 6),&vStack_3aa28);
  }
  for (iStack_3aa2c = 0; iStack_3aa2c < iStack_3aa18; iStack_3aa2c = iStack_3aa2c + 1) {
    piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,&n);
    std::istream::operator>>(piVar1,&m);
  }
  ppiStack_3aa70 =
       &v[0x2714].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage;
  do {
    ppiStack_3aa70 = ppiStack_3aa70 + -3;
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)ppiStack_3aa70);
  } while (ppiStack_3aa70 != (pointer *)&b);
  return;
}

Assistant:

void Question_1()
{
    vector<int> v[10005]; //vector<int> 数组
    int a,b,n,m;
    cin >> n >> m;
    for (int i = 0; i < n; ++i) {
        v[i].push_back(i);
    }
    for(int i = 0; i < m; i++)
    {
        cin >> a >> b;
        if (a == b)
        {
            continue;
        }

    }
}